

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * fts5ConfigSkipLiteral(char *pIn)

{
  byte bVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  char *p;
  
  bVar1 = *pIn;
  if (bVar1 < 0x4e) {
    if (bVar1 == 0x27) {
      pcVar3 = pIn + 1;
      while ((pcVar4 = pcVar3, *pcVar3 != '\'' || (pcVar4 = pcVar3 + 1, pcVar3[1] == '\''))) {
        pcVar3 = pcVar4 + 1;
        if (pcVar4[1] == '\0') {
          return (char *)0x0;
        }
      }
      return pcVar4;
    }
    if ((bVar1 == 0x2b) || (pcVar3 = pIn, bVar1 == 0x2d)) {
      pcVar3 = pIn + 1;
    }
LAB_001a065d:
    do {
      pcVar4 = pcVar3;
      pcVar3 = pcVar4 + 1;
    } while (0xf5 < (byte)(*pcVar4 - 0x3aU));
    if (*pcVar4 == '.') {
      cVar2 = *pcVar3;
      while (0xf5 < (byte)(cVar2 - 0x3aU)) {
        pcVar4 = pcVar3 + 1;
        pcVar3 = pcVar3 + 1;
        cVar2 = *pcVar4;
        pcVar4 = pcVar3;
      }
    }
    pcVar3 = (char *)0x0;
    if (pcVar4 != pIn) {
      pcVar3 = pcVar4;
    }
    return pcVar3;
  }
  if (bVar1 < 0x6e) {
    if (bVar1 == 0x4e) {
LAB_001a06a3:
      lVar7 = 0;
      do {
        if (""[(byte)"/dev/null"[lVar7 + 5]] != ""[(byte)pIn[lVar7]]) {
          return (char *)0x0;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      return pIn + 4;
    }
    pcVar3 = pIn;
    if (bVar1 != 0x58) goto LAB_001a065d;
  }
  else if (bVar1 != 0x78) {
    pcVar3 = pIn;
    if (bVar1 == 0x6e) goto LAB_001a06a3;
    goto LAB_001a065d;
  }
  if (pIn[1] != '\'') {
    return (char *)0x0;
  }
  pcVar3 = pIn + 3;
  bVar5 = false;
  do {
    if (9 < (byte)(pcVar3[-1] - 0x30U)) {
      uVar6 = (byte)pcVar3[-1] - 0x27;
      if (0x3f < uVar6) {
        return (char *)0x0;
      }
      if ((0xfc000000fc000000U >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
        if ((ulong)uVar6 != 0) {
          return (char *)0x0;
        }
        pcVar4 = (char *)0x0;
        if (!bVar5) {
          pcVar4 = pcVar3;
        }
        return pcVar4;
      }
    }
    pcVar3 = pcVar3 + 1;
    bVar5 = (bool)(bVar5 ^ 1);
  } while( true );
}

Assistant:

static const char *fts5ConfigSkipLiteral(const char *pIn){
  const char *p = pIn;
  switch( *p ){
    case 'n': case 'N':
      if( sqlite3_strnicmp("null", p, 4)==0 ){
        p = &p[4];
      }else{
        p = 0;
      }
      break;

    case 'x': case 'X':
      p++;
      if( *p=='\'' ){
        p++;
        while( (*p>='a' && *p<='f') 
            || (*p>='A' && *p<='F') 
            || (*p>='0' && *p<='9') 
            ){
          p++;
        }
        if( *p=='\'' && 0==((p-pIn)%2) ){
          p++;
        }else{
          p = 0;
        }
      }else{
        p = 0;
      }
      break;

    case '\'':
      p++;
      while( p ){
        if( *p=='\'' ){
          p++;
          if( *p!='\'' ) break;
        }
        p++;
        if( *p==0 ) p = 0;
      }
      break;

    default:
      /* maybe a number */
      if( *p=='+' || *p=='-' ) p++;
      while( fts5_isdigit(*p) ) p++;

      /* At this point, if the literal was an integer, the parse is 
      ** finished. Or, if it is a floating point value, it may continue
      ** with either a decimal point or an 'E' character. */
      if( *p=='.' && fts5_isdigit(p[1]) ){
        p += 2;
        while( fts5_isdigit(*p) ) p++;
      }
      if( p==pIn ) p = 0;

      break;
  }

  return p;
}